

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O0

int perform_k_means_palette_search
              (AV1_COMP *cpi,MACROBLOCK *x,MB_MODE_INFO *mbmi,BLOCK_SIZE bsize,int dc_mode_cost,
              int16_t *data,int lower_bound,int upper_bound,int start_n,int end_n,int step_size,
              _Bool do_header_rd_based_gating,int *last_n_searched,uint16_t *color_cache,int n_cache
              ,MB_MODE_INFO *best_mbmi,uint8_t *best_palette_color_map,int64_t *best_rd,int *rate,
              int *rate_tokenonly,int64_t *distortion,uint8_t *skippable,int *beat_best_rd,
              PICK_MODE_CONTEXT *ctx,uint8_t *best_blk_skip,uint8_t *tx_type_map,uint8_t *color_map,
              int data_points,int discount_color_cost)

{
  ulong uVar1;
  uint8_t *indices;
  uint uVar2;
  byte bVar3;
  int iVar4;
  undefined1 in_CL;
  int *in_RDX;
  int *unaff_RBX;
  _Bool *unaff_RBP;
  int *in_RSI;
  int64_t *in_RDI;
  undefined4 in_R8D;
  uint8_t *in_R9;
  PICK_MODE_CONTEXT *unaff_R12;
  uint8_t *unaff_R13;
  uint8_t *unaff_R14;
  int *unaff_R15;
  int unaff_retaddr;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  byte in_stack_00000030;
  int *in_stack_00000038;
  int16_t *in_stack_00000040;
  undefined4 in_stack_00000048;
  undefined8 in_stack_00000050;
  MB_MODE_INFO *in_stack_00000058;
  MACROBLOCK *in_stack_00000060;
  AV1_COMP *in_stack_00000068;
  int i;
  _Bool do_header_rd_based_breakout;
  int beat_best_palette_rd;
  int top_color_winner;
  int n;
  int max_itr;
  int16_t centroids [8];
  undefined1 *in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  int16_t *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  int max_itr_00;
  undefined8 in_stack_fffffffffffffeb0;
  uint in_stack_ffffffffffffff3c;
  uint in_stack_ffffffffffffff74;
  int n_00;
  int local_84;
  int iVar5;
  undefined4 uVar6;
  int in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff98;
  undefined3 in_stack_ffffffffffffffac;
  undefined4 uVar7;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  
  uVar7 = CONCAT13(in_CL,in_stack_ffffffffffffffac);
  bVar3 = in_stack_00000030 & 1;
  uVar6 = 0x32;
  local_84 = in_stack_00000020;
  while( true ) {
    max_itr_00 = (int)in_stack_fffffffffffffeb0;
    iVar5 = (int)((ulong)in_stack_fffffffffffffe88 >> 0x20);
    iVar4 = is_iter_over(in_stack_00000018,in_stack_00000020,in_stack_00000028);
    if (iVar4 != 0) {
      return local_84;
    }
    n_00 = 0;
    in_stack_ffffffffffffff74 = in_stack_ffffffffffffff74 & 0xffffff;
    for (iVar4 = 0; iVar4 < in_stack_00000018; iVar4 = iVar4 + 1) {
      uVar1 = (long)((iVar4 * 2 + 1) * (in_stack_00000010 - in_stack_00000008)) /
              (long)in_stack_00000018;
      *(short *)(&stack0xffffffffffffff88 + (long)iVar4 * 2) =
           (short)in_stack_00000008 +
           (short)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) / 2);
    }
    indices = (uint8_t *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90);
    in_stack_fffffffffffffe90 = in_stack_00000018;
    av1_k_means((int16_t *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                in_stack_fffffffffffffe98,indices,iVar5,0x32,0,max_itr_00);
    in_stack_fffffffffffffe88 = &stack0xffffffffffffff88;
    uVar2 = CONCAT13(bVar3,(int3)in_stack_ffffffffffffff3c);
    in_stack_ffffffffffffff3c = uVar2 & 0x1ffffff;
    in_stack_fffffffffffffe98 = in_stack_00000040;
    in_stack_fffffffffffffea0 = in_stack_00000048;
    in_stack_fffffffffffffeb0 = in_stack_00000050;
    iVar5 = in_stack_fffffffffffffe90;
    palette_rd_y(in_stack_00000068,in_stack_00000060,in_stack_00000058,
                 (BLOCK_SIZE)((ulong)in_stack_00000050 >> 0x38),(int)in_stack_00000050,
                 (int16_t *)(CONCAT44(uVar2,in_stack_00000048) & 0x1ffffffffffffff),
                 (int16_t *)CONCAT44(in_stack_ffffffffffffff74,iVar4),n_00,
                 (uint16_t *)CONCAT44(uVar6,in_stack_fffffffffffffe90),in_stack_ffffffffffffff88,
                 SUB81((ulong)in_stack_00000040 >> 0x38,0),
                 (MB_MODE_INFO *)CONCAT17(bVar3,in_stack_ffffffffffffff98),in_R9,
                 (int64_t *)CONCAT44(uVar7,in_R8D),in_RDX,in_RSI,in_RDI,
                 (uint8_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),unaff_RBX,
                 unaff_R12,unaff_R13,unaff_R14,unaff_R15,unaff_RBP,unaff_retaddr);
    *in_stack_00000038 = iVar5;
    if ((in_stack_ffffffffffffff74 & 0x1000000) != 0) break;
    iVar4 = iVar5;
    if ((n_00 == 0) && (iVar4 = local_84, *(int *)((long)in_RDI + 0x60b9c) == 2)) {
      return local_84;
    }
    local_84 = iVar4;
    in_stack_00000018 = in_stack_00000028 + iVar5;
  }
  *in_stack_00000038 = in_stack_00000020;
  return local_84;
}

Assistant:

static inline int perform_k_means_palette_search(
    const AV1_COMP *const cpi, MACROBLOCK *x, MB_MODE_INFO *mbmi,
    BLOCK_SIZE bsize, int dc_mode_cost, const int16_t *data, int lower_bound,
    int upper_bound, int start_n, int end_n, int step_size,
    bool do_header_rd_based_gating, int *last_n_searched, uint16_t *color_cache,
    int n_cache, MB_MODE_INFO *best_mbmi, uint8_t *best_palette_color_map,
    int64_t *best_rd, int *rate, int *rate_tokenonly, int64_t *distortion,
    uint8_t *skippable, int *beat_best_rd, PICK_MODE_CONTEXT *ctx,
    uint8_t *best_blk_skip, uint8_t *tx_type_map, uint8_t *color_map,
    int data_points, int discount_color_cost) {
  int16_t centroids[PALETTE_MAX_SIZE];
  const int max_itr = 50;
  int n = start_n;
  int top_color_winner = end_n;
  /* clang-format off */
  assert(IMPLIES(step_size < 0, start_n > end_n));
  /* clang-format on */
  assert(IMPLIES(step_size > 0, start_n < end_n));
  while (!is_iter_over(n, end_n, step_size)) {
    int beat_best_palette_rd = 0;
    bool do_header_rd_based_breakout = false;
    for (int i = 0; i < n; ++i) {
      centroids[i] =
          lower_bound + (2 * i + 1) * (upper_bound - lower_bound) / n / 2;
    }
    av1_k_means(data, centroids, color_map, data_points, n, 1, max_itr);
    palette_rd_y(cpi, x, mbmi, bsize, dc_mode_cost, data, centroids, n,
                 color_cache, n_cache, do_header_rd_based_gating, best_mbmi,
                 best_palette_color_map, best_rd, rate, rate_tokenonly,
                 distortion, skippable, beat_best_rd, ctx, best_blk_skip,
                 tx_type_map, &beat_best_palette_rd,
                 &do_header_rd_based_breakout, discount_color_cost);
    *last_n_searched = n;
    if (do_header_rd_based_breakout) {
      // Terminate palette_size search by setting last_n_searched to end_n.
      *last_n_searched = end_n;
      break;
    }
    if (beat_best_palette_rd) {
      top_color_winner = n;
    } else if (cpi->sf.intra_sf.prune_palette_search_level == 2) {
      // At search level 2, we return immediately if we don't see an improvement
      return top_color_winner;
    }
    n += step_size;
  }
  return top_color_winner;
}